

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermOut.cpp
# Opt level: O0

void __thiscall glslang::TOutputTraverser::visitSymbol(TOutputTraverser *this,TIntermSymbol *node)

{
  TInfoSink *out;
  TIntermSymbol *node_00;
  bool bVar1;
  int iVar2;
  TInfoSinkBase *pTVar3;
  undefined4 extraout_var;
  TConstUnionArray *pTVar4;
  TIntermTyped *pTVar5;
  TString local_40;
  TIntermSymbol *local_18;
  TIntermSymbol *node_local;
  TOutputTraverser *this_local;
  
  local_18 = node;
  node_local = (TIntermSymbol *)this;
  OutputTreeText(this->infoSink,(TIntermNode *)node,(this->super_TIntermTraverser).depth);
  pTVar3 = TInfoSinkBase::operator<<(&this->infoSink->debug,"\'");
  iVar2 = (*(local_18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
  pTVar3 = TInfoSinkBase::operator<<(pTVar3,(TString *)CONCAT44(extraout_var,iVar2));
  pTVar3 = TInfoSinkBase::operator<<(pTVar3,"\' (");
  TIntermTyped::getCompleteString_abi_cxx11_(&local_40,&local_18->super_TIntermTyped,false);
  pTVar3 = TInfoSinkBase::operator<<(pTVar3,&local_40);
  TInfoSinkBase::operator<<(pTVar3,")\n");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_40);
  pTVar4 = TIntermSymbol::getConstArray(local_18);
  bVar1 = TConstUnionArray::empty(pTVar4);
  node_00 = local_18;
  if (bVar1) {
    pTVar5 = TIntermSymbol::getConstSubtree(local_18);
    if (pTVar5 != (TIntermTyped *)0x0) {
      TIntermTraverser::incrementDepth(&this->super_TIntermTraverser,(TIntermNode *)local_18);
      pTVar5 = TIntermSymbol::getConstSubtree(local_18);
      (*(pTVar5->super_TIntermNode)._vptr_TIntermNode[2])(pTVar5,this);
      TIntermTraverser::decrementDepth(&this->super_TIntermTraverser);
    }
  }
  else {
    out = this->infoSink;
    pTVar4 = TIntermSymbol::getConstArray(local_18);
    OutputConstantUnion(out,&node_00->super_TIntermTyped,pTVar4,this->extraOutput,
                        (this->super_TIntermTraverser).depth + 1);
  }
  return;
}

Assistant:

void TOutputTraverser::visitSymbol(TIntermSymbol* node)
{
    OutputTreeText(infoSink, node, depth);

    infoSink.debug << "'" << node->getName() << "' (" << node->getCompleteString() << ")\n";

    if (! node->getConstArray().empty())
        OutputConstantUnion(infoSink, node, node->getConstArray(), extraOutput, depth + 1);
    else if (node->getConstSubtree()) {
        incrementDepth(node);
        node->getConstSubtree()->traverse(this);
        decrementDepth();
    }
}